

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# join_hashtable.cpp
# Opt level: O3

void __thiscall
duckdb::JoinHashTable::ScanStructure::UpdateCompactionBuffer
          (ScanStructure *this,idx_t base_count,SelectionVector *result_vector,idx_t result_count)

{
  sel_t *psVar1;
  sel_t *psVar2;
  idx_t iVar3;
  sel_t sVar4;
  
  if (result_count != 0) {
    psVar1 = result_vector->sel_vector;
    psVar2 = (this->lhs_sel_vector).sel_vector;
    iVar3 = 0;
    do {
      sVar4 = (sel_t)iVar3;
      if (psVar1 != (sel_t *)0x0) {
        sVar4 = psVar1[iVar3];
      }
      psVar2[base_count + iVar3] = sVar4;
      iVar3 = iVar3 + 1;
    } while (result_count != iVar3);
  }
  VectorOperations::Copy
            (&this->pointers,&this->rhs_pointers,result_vector,result_count,0,base_count);
  return;
}

Assistant:

void ScanStructure::UpdateCompactionBuffer(idx_t base_count, SelectionVector &result_vector, idx_t result_count) {
	// matches were found
	// record the result
	// on the LHS, we store result vector
	for (idx_t i = 0; i < result_count; i++) {
		lhs_sel_vector.set_index(base_count + i, result_vector.get_index(i));
	}

	// on the RHS, we collect their pointers
	VectorOperations::Copy(pointers, rhs_pointers, result_vector, result_count, 0, base_count);
}